

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfPredict(DiscreteExtendedKalmanFilterHelper *this)

{
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> Q;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> F;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> Phat;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> P;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffe18;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe28;
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffe38;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe40;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
  *in_stack_fffffffffffffe48;
  bool local_1;
  
  if (((ulong)in_RDI[0xf].
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data & 1) == 0) {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","ekfPredict","filter not initialized.");
    local_1 = false;
  }
  else if (((ulong)in_RDI[0xf].
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data & 0x1000000) == 0) {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","ekfPredict","initial state not set.");
    local_1 = false;
  }
  else if (((ulong)in_RDI[0xf].
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data & 0x100000000) == 0) {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","ekfPredict","initial state covariance not set."
              );
    local_1 = false;
  }
  else {
    if (((ulong)in_RDI[0xf].
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data & 0x10000) == 0) {
      iDynTree::reportWarning
                ("DiscreteExtendedKalmanFilterHelper","ekfPredict",
                 "input not updated. using old input");
    }
    (*(code *)*(in_RDI->
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ).
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data)(in_RDI,in_RDI + 1,in_RDI + 2,in_RDI + 4);
    (*(code *)(in_RDI->
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              ).
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[2])(in_RDI,in_RDI + 1,in_RDI + 5);
    toEigen((MatrixDynSize *)in_stack_fffffffffffffe48);
    toEigen((MatrixDynSize *)in_stack_fffffffffffffe48);
    toEigen((MatrixDynSize *)in_stack_fffffffffffffe48);
    toEigen((MatrixDynSize *)in_stack_fffffffffffffe48);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffe38,
              (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffe30);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::transpose(in_stack_fffffffffffffe28);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,0>>
    ::operator*(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>,0>>
    ::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              (in_RDI,in_stack_fffffffffffffe18);
    *(undefined1 *)
     ((long)&in_RDI[0xf].
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data + 2) = 0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfPredict()
{
    if (!m_is_initialized)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfPredict", "filter not initialized.");
        return false;
    }

    if (!m_initial_state_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfPredict", "initial state not set.");
        return false;
    }

    if (!m_initial_state_covariance_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfPredict", "initial state covariance not set.");
        return false;
    }

    if (!m_input_updated)
    {
        iDynTree::reportWarning("DiscreteExtendedKalmanFilterHelper", "ekfPredict", "input not updated. using old input");
    }

    // propagate states and compute jacobian
    ekf_f(m_x, m_u, m_xhat);                      ///< \f$ \hat{x}_{k+1} = f(x_k, u_k) \f$
    ekfComputeJacobianF(m_x, m_F);               ///< \f$ F \mid_{x = x_k} \f$

    using iDynTree::toEigen;
    auto P(toEigen(m_P));
    auto Phat(toEigen(m_Phat));
    auto F(toEigen(m_F));
    auto Q(toEigen(m_Q));

    // propagate covariance
    Phat = F*P*(F.transpose()) + Q;           ///< \f$ \hat{P}_{k+1} = F_k P_k F_k^T + Q \f$
    m_input_updated = false;
    return true;
}